

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * __thiscall gmath::DMatrix::operator_cast_to_SMatrix(DMatrix<double> *this)

{
  double dVar1;
  double *pdVar2;
  long in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  int i;
  int k;
  SMatrix<double,_3,_3> *ret;
  undefined4 local_18;
  undefined4 local_14;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar1 = *(double *)(*(long *)(in_RSI + 0x10) + (long)(local_14 * 3 + local_18) * 8);
      pdVar2 = SMatrix<double,_3,_3>::operator()(in_RDI,local_14,local_18);
      *pdVar2 = dVar1;
    }
  }
  return in_RDI;
}

Assistant:

operator SMatrix<S, r, c>() const
    {
      SMatrix<S, r, c> ret;

      assert(nrows == r);
      assert(ncols == c);

      for (int k=0; k<r; k++)
        for (int i=0; i<c; i++)
        {
          ret(k, i)=static_cast<S>(v[k*c+i]);
        }

      return ret;
    }